

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.cpp
# Opt level: O1

Node256 * duckdb::Node256::New(ART *art,Node *node)

{
  data_ptr_t pdVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  idx_t iVar3;
  type paVar4;
  IndexPointer IVar5;
  long *plVar6;
  pointer this;
  data_ptr_t pdVar7;
  __hash_code __code;
  long *plVar8;
  long lVar9;
  
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  IVar5 = FixedSizeAllocator::New
                    (paVar4->_M_elems[5].
                     super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                     .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl);
  (node->super_IndexPointer).data = IVar5.data & 0xffffffffffffff | 0x600000000000000;
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar4->_M_elems[5].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  plVar6 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                     ((IVar5.data & 0xffffffff) %
                     *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
  for (plVar8 = (long *)*plVar6; (IVar5.data & 0xffffffff) != plVar8[1]; plVar8 = (long *)*plVar8) {
    plVar6 = plVar8;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar6 + 0x10));
  pdVar7 = FixedSizeBuffer::Get(this,true);
  lVar9 = (ulong)((uint)(IVar5.data >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  iVar3 = (_Var2._M_head_impl)->bitmask_offset;
  pdVar1 = pdVar7 + iVar3 + lVar9;
  pdVar1[0] = '\0';
  pdVar1[1] = '\0';
  switchD_005700f1::default(pdVar1 + 8,0,0x800);
  return (Node256 *)(pdVar7 + iVar3 + lVar9);
}

Assistant:

Node256 &Node256::New(ART &art, Node &node) {
	node = Node::GetAllocator(art, NODE_256).New();
	node.SetMetadata(static_cast<uint8_t>(NODE_256));
	auto &n256 = Node::Ref<Node256>(art, node, NODE_256);

	n256.count = 0;
	for (uint16_t i = 0; i < CAPACITY; i++) {
		n256.children[i].Clear();
	}

	return n256;
}